

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfCompositeDeepScanLine.cpp
# Opt level: O0

void __thiscall
Imf_2_5::CompositeDeepScanLine::setFrameBuffer(CompositeDeepScanLine *this,FrameBuffer *fr)

{
  bool bVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  undefined1 uVar4;
  reference pvVar5;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  size_type sVar6;
  char *this_01;
  long in_RDI;
  string name;
  ConstIterator q;
  FrameBuffer *in_stack_ffffffffffffff58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff60;
  undefined5 in_stack_ffffffffffffff68;
  size_type in_stack_ffffffffffffff78;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffff80;
  const_iterator in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  allocator<char> local_41;
  string local_40 [32];
  const_iterator local_20;
  const_iterator local_18;
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::resize(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  pvVar5 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)(*(long *)(in_RDI + 8) + 0xb0),0);
  std::__cxx11::string::operator=((string *)pvVar5,"Z");
  this_01 = "Z";
  if ((*(byte *)(*(long *)(in_RDI + 8) + 0x60) & 1) != 0) {
    this_01 = "ZBack";
  }
  pvVar5 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)(*(long *)(in_RDI + 8) + 0xb0),1);
  std::__cxx11::string::operator=((string *)pvVar5,this_01);
  pvVar5 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)(*(long *)(in_RDI + 8) + 0xb0),2);
  std::__cxx11::string::operator=((string *)pvVar5,"A");
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)this_01,in_stack_ffffffffffffff78);
  local_18._M_node = (_Base_ptr)FrameBuffer::begin(in_stack_ffffffffffffff58);
  while( true ) {
    local_20._M_node = (_Base_ptr)FrameBuffer::end(in_stack_ffffffffffffff58);
    bVar1 = Imf_2_5::operator!=((ConstIterator *)in_stack_ffffffffffffff60,
                                (ConstIterator *)in_stack_ffffffffffffff58);
    if (!bVar1) break;
    this_00 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)FrameBuffer::ConstIterator::name((ConstIterator *)0x8f8592);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
               (char *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
               (allocator<char> *)in_stack_ffffffffffffff90._M_node);
    std::allocator<char>::~allocator(&local_41);
    uVar2 = std::operator==(in_stack_ffffffffffffff60,(char *)in_stack_ffffffffffffff58);
    if ((bool)uVar2) {
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff60,
                 (value_type_conflict1 *)in_stack_ffffffffffffff58);
    }
    else {
      uVar3 = std::operator==(in_stack_ffffffffffffff60,(char *)in_stack_ffffffffffffff58);
      if ((bool)uVar3) {
        in_stack_ffffffffffffffa4 = 0;
        std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff60,
                   (value_type_conflict1 *)in_stack_ffffffffffffff58);
      }
      else {
        uVar4 = std::operator==(in_stack_ffffffffffffff60,(char *)in_stack_ffffffffffffff58);
        if ((bool)uVar4) {
          in_stack_ffffffffffffffa0 = 2;
          std::vector<int,_std::allocator<int>_>::push_back
                    ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff60,
                     (value_type_conflict1 *)in_stack_ffffffffffffff58);
        }
        else {
          in_stack_ffffffffffffff60 =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               (*(long *)(in_RDI + 8) + 200);
          sVar6 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)(*(long *)(in_RDI + 8) + 0xb0));
          in_stack_ffffffffffffff9c = (undefined4)sVar6;
          std::vector<int,_std::allocator<int>_>::push_back
                    ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff60,
                     (value_type_conflict1 *)in_stack_ffffffffffffff58);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(this_00,(value_type *)
                              CONCAT17(uVar2,CONCAT16(uVar3,CONCAT15(uVar4,in_stack_ffffffffffffff68
                                                                    ))));
        }
      }
    }
    std::__cxx11::string::~string(local_40);
    in_stack_ffffffffffffff90._M_node =
         (_Base_ptr)
         FrameBuffer::ConstIterator::operator++((ConstIterator *)in_stack_ffffffffffffff58,0);
  }
  FrameBuffer::operator=((FrameBuffer *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  return;
}

Assistant:

void
CompositeDeepScanLine::setFrameBuffer(const FrameBuffer& fr)
{
    
    //
    // count channels; build map between channels in frame buffer
    // and channels in internal buffers
    //
    
    _Data->_channels.resize(3);
    _Data->_channels[0]="Z";
    _Data->_channels[1]=_Data->_zback ? "ZBack" : "Z";
    _Data->_channels[2]="A";
    _Data->_bufferMap.resize(0);
    
    for(FrameBuffer::ConstIterator q=fr.begin();q!=fr.end();q++)
    {
        string name(q.name());
        if(name=="ZBack")
        {
            _Data->_bufferMap.push_back(1);
        }else if(name=="Z")
        {
            _Data->_bufferMap.push_back(0);
        }else if(name=="A")
        {
            _Data->_bufferMap.push_back(2);
        }else{
            _Data->_bufferMap.push_back(_Data->_channels.size());
            _Data->_channels.push_back(name);
        }
    }
    
  _Data->_outputFrameBuffer=fr;
}